

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::V0LayerParameter::InternalSerializeWithCachedSizesToArray
          (V0LayerParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  int iVar2;
  string *psVar3;
  FillerParameter *pFVar4;
  HDF5OutputParameter *this_00;
  void *pvVar5;
  bool bVar6;
  Type *this_01;
  LogMessage *pLVar7;
  Rep *pRVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int index;
  byte *pbVar14;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar10 = (this->_has_bits_).has_bits_[0];
  if ((uVar10 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.name");
    psVar3 = (this->name_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar10 & 2) != 0) {
    psVar3 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.type");
    psVar3 = (this->type_).ptr_;
    *target = 0x12;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar10 >> 8 & 1) != 0) {
    uVar11 = this->num_output_;
    *target = 0x18;
    pbVar14 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x17 & 1) != 0) {
    bVar6 = this->biasterm_;
    *target = 0x20;
    target[1] = bVar6;
    target = target + 2;
  }
  if ((uVar10 & 0x20) != 0) {
    pFVar4 = this->weight_filler_;
    *target = 0x2a;
    pbVar14 = target + 1;
    uVar11 = pFVar4->_cached_size_;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar4,false,pbVar14 + 1);
  }
  if ((uVar10 & 0x40) != 0) {
    pFVar4 = this->bias_filler_;
    *target = 0x32;
    pbVar14 = target + 1;
    uVar11 = pFVar4->_cached_size_;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(pFVar4,false,pbVar14 + 1);
  }
  if ((uVar10 >> 9 & 1) != 0) {
    uVar11 = this->pad_;
    *target = 0x38;
    pbVar14 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 10 & 1) != 0) {
    uVar11 = this->kernelsize_;
    *target = 0x40;
    pbVar14 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x18 & 1) != 0) {
    uVar11 = this->group_;
    *target = 0x48;
    pbVar14 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x19 & 1) != 0) {
    uVar11 = this->stride_;
    *target = 0x50;
    pbVar14 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0xb & 1) != 0) {
    uVar12 = (ulong)this->pool_;
    pbVar14 = target + 1;
    *target = 0x58;
    uVar13 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar14 = (byte)uVar12 | 0x80;
        uVar13 = uVar12 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar12;
        uVar12 = uVar13;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar13;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x1a & 1) != 0) {
    fVar1 = this->dropout_ratio_;
    *target = 0x65;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar10 >> 0x1b & 1) != 0) {
    uVar11 = this->local_size_;
    *target = 0x68;
    pbVar14 = target + 1;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x1c & 1) != 0) {
    fVar1 = this->alpha_;
    *target = 0x75;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar10 >> 0x1d & 1) != 0) {
    fVar1 = this->beta_;
    *target = 0x7d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar10 & 4) != 0) {
    psVar3 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.source");
    psVar3 = (this->source_).ptr_;
    target[0] = 0x82;
    target[1] = 1;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 2);
  }
  if ((uVar10 >> 0x1e & 1) != 0) {
    fVar1 = this->scale_;
    target[0] = 0x8d;
    target[1] = 1;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  if ((uVar10 & 8) != 0) {
    psVar3 = (this->meanfile_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.meanfile");
    psVar3 = (this->meanfile_).ptr_;
    target[0] = 0x92;
    target[1] = 1;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 2);
  }
  if ((uVar10 >> 0xc & 1) != 0) {
    uVar11 = this->batchsize_;
    target[0] = 0x98;
    target[1] = 1;
    pbVar14 = target + 2;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0xd & 1) != 0) {
    uVar11 = this->cropsize_;
    target[0] = 0xa0;
    target[1] = 1;
    pbVar14 = target + 2;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((short)uVar10 < 0) {
    bVar6 = this->mirror_;
    target[0] = 0xa8;
    target[1] = 1;
    target[2] = bVar6;
    target = target + 3;
  }
  if ((int)uVar10 < 0) {
    fVar1 = this->k_;
    target[0] = 0xb5;
    target[1] = 1;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  iVar2 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                          (&(this->blobs_).super_RepeatedPtrFieldBase,index);
      target[0] = 0x92;
      target[1] = 3;
      pbVar14 = target + 2;
      uVar11 = this_01->_cached_size_;
      uVar9 = uVar11;
      if (0x7f < uVar11) {
        do {
          *pbVar14 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar14 = pbVar14 + 1;
          bVar6 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar6);
      }
      *pbVar14 = (byte)uVar9;
      target = BlobProto::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar14 + 1);
      index = index + 1;
    } while (index != iVar2);
  }
  uVar11 = (this->blobs_lr_).current_size_;
  if (uVar11 != 0) {
    pRVar8 = (this->blobs_lr_).rep_;
    if (pRVar8 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar7 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar7);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar8 = (this->blobs_lr_).rep_;
    }
    uVar12 = 1;
    if (1 < (int)uVar11) {
      uVar12 = (ulong)uVar11;
    }
    uVar13 = 0;
    do {
      fVar1 = pRVar8->elements[uVar13];
      target[0] = 0x9d;
      target[1] = 3;
      *(float *)(target + 2) = fVar1;
      target = target + 6;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  uVar11 = (this->weight_decay_).current_size_;
  if (uVar11 != 0) {
    pRVar8 = (this->weight_decay_).rep_;
    if (pRVar8 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar7 = google::protobuf::internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar7);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      pRVar8 = (this->weight_decay_).rep_;
    }
    uVar12 = 1;
    if (1 < (int)uVar11) {
      uVar12 = (ulong)uVar11;
    }
    uVar13 = 0;
    do {
      fVar1 = pRVar8->elements[uVar13];
      target[0] = 0xa5;
      target[1] = 3;
      *(float *)(target + 2) = fVar1;
      target = target + 6;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if ((uVar10 >> 0x11 & 1) != 0) {
    uVar10 = this->rand_skip_;
    target[0] = 0xa8;
    target[1] = 3;
    pbVar14 = target + 2;
    uVar11 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar14 = (byte)uVar10 | 0x80;
        uVar11 = uVar10 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar10;
        uVar10 = uVar11;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar11;
    target = pbVar14 + 1;
  }
  uVar10 = (this->_has_bits_).has_bits_[1];
  if ((uVar10 & 1) != 0) {
    fVar1 = this->det_fg_threshold_;
    target[0] = 0xb5;
    target[1] = 3;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  if ((uVar10 & 2) != 0) {
    fVar1 = this->det_bg_threshold_;
    target[0] = 0xbd;
    target[1] = 3;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  if ((uVar10 & 4) != 0) {
    fVar1 = this->det_fg_fraction_;
    target[0] = 0xc5;
    target[1] = 3;
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  uVar10 = (this->_has_bits_).has_bits_[0];
  if ((uVar10 >> 0x12 & 1) != 0) {
    uVar11 = this->det_context_pad_;
    target[0] = 0xd0;
    target[1] = 3;
    pbVar14 = target + 2;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((uVar10 & 0x10) != 0) {
    psVar3 = (this->det_crop_mode_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "caffe.V0LayerParameter.det_crop_mode");
    psVar3 = (this->det_crop_mode_).ptr_;
    target[0] = 0xda;
    target[1] = 3;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 2);
  }
  if ((uVar10 >> 0x13 & 1) != 0) {
    uVar12 = (ulong)this->new_num_;
    pbVar14 = target + 2;
    target[0] = 0xe0;
    target[1] = 3;
    uVar13 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar14 = (byte)uVar12 | 0x80;
        uVar13 = uVar12 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar12;
        uVar12 = uVar13;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar13;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x14 & 1) != 0) {
    uVar12 = (ulong)this->new_channels_;
    pbVar14 = target + 2;
    target[0] = 0xe8;
    target[1] = 3;
    uVar13 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar14 = (byte)uVar12 | 0x80;
        uVar13 = uVar12 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar12;
        uVar12 = uVar13;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar13;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x15 & 1) != 0) {
    uVar12 = (ulong)this->new_height_;
    pbVar14 = target + 2;
    target[0] = 0xf0;
    target[1] = 3;
    uVar13 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar14 = (byte)uVar12 | 0x80;
        uVar13 = uVar12 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar12;
        uVar12 = uVar13;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar13;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0xe & 1) != 0) {
    uVar12 = (ulong)this->new_width_;
    pbVar14 = target + 2;
    target[0] = 0xf8;
    target[1] = 3;
    uVar13 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar14 = (byte)uVar12 | 0x80;
        uVar13 = uVar12 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar12;
        uVar12 = uVar13;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar13;
    target = pbVar14 + 1;
  }
  if ((uVar10 >> 0x10 & 1) != 0) {
    bVar6 = this->shuffle_images_;
    target[0] = 0x80;
    target[1] = 4;
    target[2] = bVar6;
    target = target + 3;
  }
  if ((uVar10 >> 0x16 & 1) != 0) {
    uVar11 = this->concat_dim_;
    target[0] = 0x88;
    target[1] = 4;
    pbVar14 = target + 2;
    uVar9 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar14 = (byte)uVar11 | 0x80;
        uVar9 = uVar11 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar11;
        uVar11 = uVar9;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar9;
    target = pbVar14 + 1;
  }
  if ((char)uVar10 < '\0') {
    this_00 = this->hdf5_output_param_;
    target[0] = 0xca;
    target[1] = 0x3e;
    pbVar14 = target + 2;
    uVar10 = this_00->_cached_size_;
    uVar11 = uVar10;
    if (0x7f < uVar10) {
      do {
        *pbVar14 = (byte)uVar10 | 0x80;
        uVar11 = uVar10 >> 7;
        pbVar14 = pbVar14 + 1;
        bVar6 = 0x3fff < uVar10;
        uVar10 = uVar11;
      } while (bVar6);
    }
    *pbVar14 = (byte)uVar11;
    target = HDF5OutputParameter::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar14 + 1)
    ;
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* V0LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V0LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->type(), target);
  }

  // optional uint32 num_output = 3;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3, this->num_output(), target);
  }

  // optional bool biasterm = 4 [default = true];
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(4, this->biasterm(), target);
  }

  // optional .caffe.FillerParameter weight_filler = 5;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 6;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, *this->bias_filler_, deterministic, target);
  }

  // optional uint32 pad = 7 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7, this->pad(), target);
  }

  // optional uint32 kernelsize = 8;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(8, this->kernelsize(), target);
  }

  // optional uint32 group = 9 [default = 1];
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->group(), target);
  }

  // optional uint32 stride = 10 [default = 1];
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->stride(), target);
  }

  // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      11, this->pool(), target);
  }

  // optional float dropout_ratio = 12 [default = 0.5];
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(12, this->dropout_ratio(), target);
  }

  // optional uint32 local_size = 13 [default = 5];
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(13, this->local_size(), target);
  }

  // optional float alpha = 14 [default = 1];
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(14, this->alpha(), target);
  }

  // optional float beta = 15 [default = 0.75];
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(15, this->beta(), target);
  }

  // optional string source = 16;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        16, this->source(), target);
  }

  // optional float scale = 17 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(17, this->scale(), target);
  }

  // optional string meanfile = 18;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->meanfile().data(), this->meanfile().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.meanfile");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        18, this->meanfile(), target);
  }

  // optional uint32 batchsize = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(19, this->batchsize(), target);
  }

  // optional uint32 cropsize = 20 [default = 0];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(20, this->cropsize(), target);
  }

  // optional bool mirror = 21 [default = false];
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(21, this->mirror(), target);
  }

  // optional float k = 22 [default = 1];
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(22, this->k(), target);
  }

  // repeated .caffe.BlobProto blobs = 50;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        50, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 51;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(51, this->blobs_lr_, target);

  // repeated float weight_decay = 52;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(52, this->weight_decay_, target);

  // optional uint32 rand_skip = 53 [default = 0];
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(53, this->rand_skip(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional float det_fg_threshold = 54 [default = 0.5];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(54, this->det_fg_threshold(), target);
  }

  // optional float det_bg_threshold = 55 [default = 0.5];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(55, this->det_bg_threshold(), target);
  }

  // optional float det_fg_fraction = 56 [default = 0.25];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(56, this->det_fg_fraction(), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional uint32 det_context_pad = 58 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(58, this->det_context_pad(), target);
  }

  // optional string det_crop_mode = 59 [default = "warp"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->det_crop_mode().data(), this->det_crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.det_crop_mode");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        59, this->det_crop_mode(), target);
  }

  // optional int32 new_num = 60 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(60, this->new_num(), target);
  }

  // optional int32 new_channels = 61 [default = 0];
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(61, this->new_channels(), target);
  }

  // optional int32 new_height = 62 [default = 0];
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(62, this->new_height(), target);
  }

  // optional int32 new_width = 63 [default = 0];
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(63, this->new_width(), target);
  }

  // optional bool shuffle_images = 64 [default = false];
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(64, this->shuffle_images(), target);
  }

  // optional uint32 concat_dim = 65 [default = 1];
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(65, this->concat_dim(), target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1001, *this->hdf5_output_param_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V0LayerParameter)
  return target;
}